

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Situations * __thiscall
parser::Parser::goTo
          (Situations *__return_storage_ptr__,Parser *this,Grammar *grammar,Situations *situations,
          GrammaticSymbol *grammaticSymbol)

{
  pointer pGVar1;
  pointer pSVar2;
  const_iterator __position;
  iterator iVar3;
  undefined8 uVar4;
  ulong uVar5;
  pointer pSVar6;
  iterator goToSit;
  ulong uVar7;
  Situations goToSituations;
  vector<parser::Situation,_std::allocator<parser::Situation>_> local_48;
  
  local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_start = (value_type *)0x0;
  local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_finish = (value_type *)0x0;
  local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar6 = (situations->super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (situations->super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar6 != pSVar2) {
    do {
      pGVar1 = (pSVar6->super_Convolution).body.
               super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(pSVar6->super_Convolution).body.
                    super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1 >> 3;
      uVar7 = pSVar6->point;
      if (uVar5 != uVar7) {
        if (uVar5 <= uVar7) {
          uVar4 = std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
          std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_48);
          _Unwind_Resume(uVar4);
        }
        if ((pGVar1[uVar7].value == grammaticSymbol->value) &&
           (pGVar1[uVar7].isTerminal == grammaticSymbol->isTerminal)) {
          std::vector<parser::Situation,_std::allocator<parser::Situation>_>::push_back
                    (&local_48,pSVar6);
          pSVar2 = (situations->
                   super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar2);
    if (local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->
      super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pSVar6 = local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl
          .super__Vector_impl_data._M_start !=
          local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        do {
          pSVar6->point = pSVar6->point + 1;
          closure(__return_storage_ptr__,grammar,pSVar6);
          pSVar6 = pSVar6 + 1;
        } while (pSVar6 != local_48.
                           super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (0 < (long)pSVar6 -
              (long)local_48.
                    super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>)._M_impl.
             super__Vector_impl_data._M_start;
        uVar7 = (ulong)((long)pSVar6 -
                       (long)local_48.
                             super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x30 + 1;
        pSVar6 = local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          iVar3 = std::vector<parser::Situation,_std::allocator<parser::Situation>_>::insert
                            (__return_storage_ptr__,__position,pSVar6);
          __position._M_current = iVar3._M_current + 1;
          pSVar6 = pSVar6 + 1;
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
      }
      goto LAB_00115d30;
    }
  }
  (__return_storage_ptr__->super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00115d30:
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Situations goTo(Grammar const& grammar,
                        Situations const& situations,
                        GrammaticSymbol const& grammaticSymbol) {
            Situations goToSituations;
            for_each_c(Situations, situations, s) {
                if (s->body.size() == s->point)
                    continue;
                if (s->body.at(s->point) == grammaticSymbol) {
                    goToSituations.push_back(*s);
                }
            }
            if (goToSituations.empty()) {
                return Situations();
            }
            Situations goToClosure;
            for_each(Situations, goToSituations, goToSit) {
                goToSit->point++;
                closure(goToClosure, grammar, *goToSit);
            }
            std::copy(goToSituations.begin(), goToSituations.end(), std::inserter(goToClosure, goToClosure.begin()));
            return goToClosure;
        }